

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

void __thiscall
Semantic::Err::UndeclaredLocalVariable::~UndeclaredLocalVariable(UndeclaredLocalVariable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->super_Error = (Error)&PTR__UndeclaredLocalVariable_0014c440;
  pcVar2 = (this->varName)._M_dataplus._M_p;
  paVar1 = &(this->varName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

UndeclaredLocalVariable(std::string varName) : Error() {
                this->varName = varName;
            }